

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.cpp
# Opt level: O2

Vec2 __thiscall nite::Vec2::operator+(Vec2 *this,float c)

{
  float fVar1;
  Vec2 VVar2;
  float *in_RSI;
  float in_XMM0_Db;
  
  fVar1 = in_RSI[1];
  this->x = *in_RSI + c;
  this->y = c + fVar1;
  VVar2.y = in_XMM0_Db;
  VVar2.x = c + fVar1;
  return VVar2;
}

Assistant:

nite::Vec2 nite::Vec2::operator+(float c){
	Vec2 R = *this;
	R.x += c;
	R.y += c;
	return R;
}